

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

bool google::protobuf::internal::InternalPackFrom
               (Message *message,UrlType *dst_url,ValueType *dst_value)

{
  bool bVar1;
  GetTypeNameReturnType local_60;
  string_view local_40;
  string_view local_30;
  ValueType *local_20;
  ValueType *dst_value_local;
  UrlType *dst_url_local;
  Message *message_local;
  
  local_20 = dst_value;
  dst_value_local = dst_url;
  dst_url_local = (UrlType *)message;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"type.googleapis.com/");
  MessageLite::GetTypeName_abi_cxx11_(&local_60,(MessageLite *)dst_url_local);
  local_40 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  bVar1 = InternalPackFromLite
                    (&message->super_MessageLite,local_30,local_40,dst_value_local,local_20);
  std::__cxx11::string::~string((string *)&local_60);
  return bVar1;
}

Assistant:

bool InternalPackFrom(const Message& message, UrlType* dst_url,
                      ValueType* dst_value) {
  return InternalPackFromLite(message, kTypeGoogleApisComPrefix,
                              message.GetTypeName(), dst_url, dst_value);
}